

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_tcpdial.c
# Opt level: O1

int tcp_dialer_set_locaddr(void *arg,void *buf,size_t sz,nni_type t)

{
  int iVar1;
  size_t sVar2;
  long lVar3;
  uint64_t *puVar4;
  uint64_t *puVar5;
  byte bVar6;
  undefined1 local_130 [8];
  nng_sockaddr sa;
  sockaddr_storage ss;
  
  bVar6 = 0;
  iVar1 = nni_copyin_sockaddr((nng_sockaddr *)local_130,buf,t);
  if (iVar1 == 0) {
    sVar2 = nni_posix_nn2sockaddr(sa.s_ipc.sa_path + 0x7e,(nni_sockaddr *)local_130);
    iVar1 = 0xf;
    if ((sVar2 != 0) &&
       (((sa.s_storage.sa_pad[0xf]._0_2_ == 10 || (sa.s_storage.sa_pad[0xf]._0_2_ == 2)) &&
        (sa.s_storage.sa_pad[0xf]._2_2_ == 0)))) {
      if (arg == (void *)0x0) {
        iVar1 = 0;
      }
      else {
        nni_mtx_lock((nni_mtx *)((long)arg + 0xa8));
        iVar1 = 7;
        if (*(char *)((long)arg + 0x18) == '\0') {
          puVar4 = sa.s_storage.sa_pad + 0xf;
          puVar5 = (uint64_t *)((long)arg + 0x20);
          for (lVar3 = 0x10; lVar3 != 0; lVar3 = lVar3 + -1) {
            *puVar5 = *puVar4;
            puVar4 = puVar4 + (ulong)bVar6 * -2 + 1;
            puVar5 = puVar5 + (ulong)bVar6 * -2 + 1;
          }
          *(size_t *)((long)arg + 0xa0) = sVar2;
          iVar1 = 0;
        }
        nni_mtx_unlock((nni_mtx *)((long)arg + 0xa8));
      }
    }
  }
  return iVar1;
}

Assistant:

static int
tcp_dialer_set_locaddr(void *arg, const void *buf, size_t sz, nni_type t)
{
	nni_tcp_dialer         *d = arg;
	nng_sockaddr            sa;
	struct sockaddr_storage ss;
	struct sockaddr_in     *sin;
	size_t                  len;
	int                     rv;
#ifdef NNG_ENABLE_IPV6
	struct sockaddr_in6 *sin6;
#endif
	NNI_ARG_UNUSED(sz);

	if ((rv = nni_copyin_sockaddr(&sa, buf, t)) != 0) {
		return (rv);
	}
	if ((len = nni_posix_nn2sockaddr(&ss, &sa)) == 0) {
		return (NNG_EADDRINVAL);
	}
	// Ensure we are either IPv4 or IPv6, and port is not set.  (We
	// do not allow binding to a specific port.)
	switch (ss.ss_family) {
	case AF_INET:
		sin = (void *) &ss;
		if (sin->sin_port != 0) {
			return (NNG_EADDRINVAL);
		}
		break;

#ifdef NNG_ENABLE_IPV6
	case AF_INET6:
		sin6 = (void *) &ss;
		if (sin6->sin6_port != 0) {
			return (NNG_EADDRINVAL);
		}
		break;
#endif // __NG_INET6

	default:
		return (NNG_EADDRINVAL);
	}
	if (d != NULL) {
		nni_mtx_lock(&d->mtx);
		if (d->closed) {
			nni_mtx_unlock(&d->mtx);
			return (NNG_ECLOSED);
		}
		d->src    = ss;
		d->srclen = len;
		nni_mtx_unlock(&d->mtx);
	}
	return (0);
}